

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_x509.cc
# Opt level: O2

int write_signer_digest_algos(CBB *digest_algos_set,void *arg)

{
  int iVar1;
  EVP_MD *md;
  
  md = EVP_MD_CTX_get0_md((EVP_MD_CTX *)((long)arg + 8));
  iVar1 = EVP_marshal_digest_algorithm_no_params(digest_algos_set,md);
  return iVar1;
}

Assistant:

static int write_signer_digest_algos(CBB *digest_algos_set, void *arg) {
  auto *si_data = static_cast<struct signer_info_data *>(arg);
  // https://www.rfc-editor.org/rfc/rfc5754.html#section-2
  // "Implementations MUST generate SHA2 AlgorithmIdentifiers with absent
  //  parameters."
  return EVP_marshal_digest_algorithm_no_params(
      digest_algos_set, EVP_MD_CTX_get0_md(si_data->sign_ctx.get()));
}